

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pio.c
# Opt level: O2

lineiter_t * lineiter_start(FILE *fh)

{
  lineiter_t *plVar1;
  char *pcVar2;
  size_t __n;
  
  plVar1 = (lineiter_t *)
           __ckd_calloc__(1,0x20,
                          "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/util/pio.c"
                          ,0x10d);
  pcVar2 = (char *)__ckd_malloc__(0x80,
                                  "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/util/pio.c"
                                  ,0x10e);
  plVar1->buf = pcVar2;
  *pcVar2 = '\0';
  plVar1->bsiz = 0x80;
  plVar1->len = 0;
  plVar1->fh = fh;
  plVar1 = lineiter_next(plVar1);
  if ((((plVar1 != (lineiter_t *)0x0) && (pcVar2 = plVar1->buf, *pcVar2 == -0x11)) &&
      (pcVar2[1] == -0x45)) && (pcVar2[2] == -0x41)) {
    __n = strlen(pcVar2 + 1);
    memmove(pcVar2,pcVar2 + 3,__n);
    plVar1->len = plVar1->len + -3;
  }
  return plVar1;
}

Assistant:

lineiter_t *
lineiter_start(FILE *fh)
{
    lineiter_t *li;

    li = (lineiter_t *)ckd_calloc(1, sizeof(*li));
    li->buf = (char *)ckd_malloc(128);
    li->buf[0] = '\0';
    li->bsiz = 128;
    li->len = 0;
    li->fh = fh;

    li = lineiter_next(li);
    
    /* Strip the UTF-8 BOM */
    
    if (li && 0 == strncmp(li->buf, "\xef\xbb\xbf", 3)) {
	memmove(li->buf, li->buf + 3, strlen(li->buf + 1));
	li->len -= 3;
    }
    
    return li;
}